

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

void rapidjson::internal::Grisu2(double value,char *buffer,int *length,int *K)

{
  uint uVar1;
  DiyFp DVar2;
  DiyFp DVar3;
  DiyFp w_p;
  DiyFp w_m;
  DiyFp v;
  DiyFp local_90;
  DiyFp local_80;
  DiyFp local_70;
  DiyFp local_60;
  DiyFp local_50;
  DiyFp local_40;
  
  uVar1 = (uint)((ulong)value >> 0x34) & 0x7ff;
  local_40.f = ((ulong)value & 0xfffffffffffff) + 0x10000000000000;
  if (uVar1 == 0) {
    local_40.f = (ulong)value & 0xfffffffffffff;
  }
  local_40.e = -0x432;
  if (uVar1 != 0) {
    local_40.e = uVar1 - 0x433;
  }
  local_50.f = 0;
  local_50.e = 0;
  local_60.f = 0;
  local_60.e = 0;
  DiyFp::NormalizedBoundaries(&local_40,&local_50,&local_60);
  DVar2 = GetCachedPower(local_60.e,K);
  local_70.f = DVar2.f;
  local_70.e = DVar2.e;
  DVar2 = DiyFp::Normalize(&local_40);
  local_90.f = DVar2.f;
  local_90.e = DVar2.e;
  DVar2 = DiyFp::operator*(&local_90,&local_70);
  local_80.f = DVar2.f;
  local_80.e = DVar2.e;
  DVar2 = DiyFp::operator*(&local_60,&local_70);
  local_90.e = DVar2.e;
  DVar3 = DiyFp::operator*(&local_50,&local_70);
  local_90.f = DVar2.f - 1;
  DigitGen(&local_80,&local_90,(~DVar3.f + DVar2.f) - 1,buffer,length,K);
  return;
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
    const DiyFp v(value);
    DiyFp w_m, w_p;
    v.NormalizedBoundaries(&w_m, &w_p);

    const DiyFp c_mk = GetCachedPower(w_p.e, K);
    const DiyFp W = v.Normalize() * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}